

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8b17::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<2> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  State *pSVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char solution [81];
  State local_240;
  
  auVar16 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][0].configurations.vec);
  auVar17 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][1].configurations.vec);
  auVar20._8_8_ = 0xf000e00040000;
  auVar20._0_8_ = 0xf000e00040000;
  auVar19 = vpunpcklqdq_avx(auVar16,auVar17);
  auVar16 = vpunpckhqdq_avx(auVar16,auVar17);
  auVar18 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][2].configurations.vec);
  auVar16 = vpaddq_avx(auVar19,auVar16);
  auVar19 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][0].configurations.vec);
  auVar17 = vpunpcklqdq_avx(auVar18,auVar19);
  auVar19 = vpunpckhqdq_avx(auVar18,auVar19);
  auVar18 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][1].configurations.vec);
  auVar19 = vpaddq_avx(auVar17,auVar19);
  auVar17 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][2].configurations.vec);
  auVar22 = vpunpcklqdq_avx(auVar18,auVar17);
  auVar5 = vpunpckhqdq_avx(auVar18,auVar17);
  auVar17 = vpcmpeqd_avx(auVar17,auVar17);
  auVar20 = vpermi2w_avx512vl(auVar20,auVar16,auVar17);
  auVar17 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar18 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar16 = vpaddq_avx(auVar22,auVar5);
  auVar19 = vpermi2w_avx512vl(auVar17,auVar20,auVar19);
  auVar16 = vpermi2w_avx512vl(auVar18,auVar19,auVar16);
  auVar19._8_2_ = 0xfff6;
  auVar19._0_8_ = 0xfff6fff6fff6fff6;
  auVar19._10_2_ = 0xfff6;
  auVar19._12_2_ = 0xfff6;
  auVar19._14_2_ = 0xfff6;
  auVar16 = vpaddw_avx(auVar16,auVar19);
  auVar16 = vphminposuw_avx(auVar16);
  if ((auVar16 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    uVar10 = (ulong)(auVar16._0_4_ >> 0x10);
    uVar13 = *(uint *)((anonymous_namespace)::tables + uVar10 * 4 + 0x18dc);
    auVar19 = *(undefined1 (*) [16])
               (this->solution_).bands
               [*(int *)((anonymous_namespace)::tables + uVar10 * 4 + 0x18b8)][(int)uVar13].
               configurations.vec;
    auVar17 = vpshufb_avx(auVar19,_DAT_0010ab30);
    auVar18 = vpblendd_avx2(auVar17,(undefined1  [16])0x0,8);
    auVar5 = vpshufb_avx(auVar17,_DAT_0010ab40);
    auVar17 = vpand_avx(auVar19,auVar18);
    auVar18 = vpor_avx(auVar19,auVar18);
    auVar22 = vpshufb_avx(auVar5,_DAT_0010ab30);
    auVar19 = vpand_avx(auVar17,auVar5);
    auVar21 = vpternlogq_avx512vl(auVar17,auVar18,auVar5,0xf8);
    auVar17 = vpor_avx(auVar18,auVar5);
    auVar20 = vpblendd_avx2(auVar22,(undefined1  [16])0x0,8);
    auVar18 = vpshufb_avx(auVar22,_DAT_0010ab40);
    auVar22 = vpternlogq_avx512vl(auVar19,auVar21,auVar20,0xf8);
    auVar21 = vpternlogq_avx512vl(auVar21,auVar17,auVar20,0xf8);
    auVar17 = vpor_avx(auVar17,auVar20);
    auVar5 = vpshufb_avx(auVar18,_DAT_0010ab40);
    auVar23 = vpternlogq_avx512vl(auVar22,auVar21,auVar18,0xf8);
    auVar21 = vpternlogq_avx512vl(auVar21,auVar17,auVar18,0xf8);
    auVar17 = vpor_avx(auVar17,auVar18);
    auVar24 = vpternlogq_avx512vl(auVar23,auVar21,auVar5,0xf8);
    auVar17 = vpternlogq_avx512vl(auVar17,auVar21,auVar5,0xec);
    if ((auVar17 & ~auVar24) == (undefined1  [16])0x0) {
      auVar17 = vpand_avx(auVar22,auVar18);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar19,auVar20,0xf8);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar23,auVar5,0xf8);
      if ((auVar24 & ~auVar17) != (undefined1  [16])0x0) {
        auVar17 = vpandn_avx(auVar17,auVar24);
      }
    }
    else {
      auVar17 = vpandn_avx(auVar24,auVar17);
    }
    auVar19 = vpcmpeqd_avx(auVar19,auVar19);
    auVar19 = vpsignw_avx(auVar17,auVar19);
    auVar19 = vpand_avx(auVar17,auVar19);
    (anonymous_namespace)::solver_enum._496_8_ = (anonymous_namespace)::solver_enum._496_8_ + 1;
    if (auVar16._0_4_ < 0x30000) {
      auVar16 = *(undefined1 (*) [16])(this->solution_).bands[0][(int)uVar13].configurations.vec;
      bVar8 = false;
      lVar9 = 0;
      pSVar11 = &local_240;
      do {
        lVar12 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar11->bands + -1) + 0x50 + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar11->bands[0][0].configurations.vec + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0x70);
        lVar9 = 1;
        bVar7 = !bVar8;
        bVar8 = true;
        pSVar11 = (State *)(local_240.bands + 1);
      } while (bVar7);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      pSVar11 = (State *)(ulong)uVar13;
      auVar16 = vpand_avx(auVar16,auVar19);
      uVar10 = vpcmpgtq_avx512vl(auVar16,(undefined1  [16])0x0);
      auVar19 = vpcmpgtq_avx(auVar16,(undefined1  [16])0x0);
      auVar19 = vpslldq_avx(auVar19,1);
      auVar5._8_8_ = 1;
      auVar5._0_8_ = 1;
      auVar19 = vandnpd_avx512vl(auVar19,auVar5);
      auVar19 = vpsubq_avx512vl(auVar16,auVar19);
      bVar8 = (bool)((byte)(uVar10 & 3) & 1);
      auVar22._0_8_ = (ulong)bVar8 * auVar19._0_8_ | (ulong)!bVar8 * auVar16._0_8_;
      uVar10 = (uVar10 & 3) >> 1;
      auVar22._8_8_ = uVar10 * auVar19._8_8_ | (ulong)!SUB81(uVar10,0) * auVar16._8_8_;
      auVar19 = vpand_avx(auVar22,auVar16);
      auVar17 = vpor_avx(auVar19,*(undefined1 (*) [16])
                                  local_240.bands[0][(int)uVar13].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][(int)uVar13].eliminations.vec = auVar17;
      bVar8 = BandEliminate<0>(&local_240,uVar13,0);
      if ((bVar8) &&
         (CountSolutionsConsistentWithPartialAssignment
                    ((SolverDpllTriadSimd<2> *)&local_240,pSVar11),
         (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_))
      {
        return;
      }
      pSVar11 = (State *)(ulong)uVar13;
      auVar16 = vpternlogq_avx512vl(auVar16,auVar19,
                                    *(undefined1 (*) [16])
                                     (this->solution_).bands[0][(int)uVar13].eliminations.vec,0xbe);
      *(undefined1 (*) [16])(this->solution_).bands[0][(int)uVar13].eliminations.vec = auVar16;
      bVar8 = BandEliminate<0>(&this->solution_,uVar13,0);
    }
    else {
      bVar8 = false;
      lVar9 = 0;
      auVar16 = *(undefined1 (*) [16])(this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec;
      pSVar11 = &local_240;
      do {
        lVar12 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar11->bands + -1) + 0x50 + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar11->bands[0][0].configurations.vec + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0x70);
        lVar9 = 1;
        bVar7 = !bVar8;
        bVar8 = true;
        pSVar11 = (State *)(local_240.bands + 1);
      } while (bVar7);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar16 = vpand_avx(auVar16,auVar19);
      uVar10 = vpcmpgtq_avx512vl(auVar16,(undefined1  [16])0x0);
      auVar19 = vpcmpgtq_avx(auVar16,(undefined1  [16])0x0);
      auVar19 = vpslldq_avx(auVar19,1);
      auVar17._8_8_ = 1;
      auVar17._0_8_ = 1;
      auVar19 = vandnpd_avx512vl(auVar19,auVar17);
      auVar19 = vpsubq_avx512vl(auVar16,auVar19);
      bVar8 = (bool)((byte)(uVar10 & 3) & 1);
      auVar18._0_8_ = (ulong)bVar8 * auVar19._0_8_ | (ulong)!bVar8 * auVar16._0_8_;
      uVar10 = (uVar10 & 3) >> 1;
      auVar18._8_8_ = uVar10 * auVar19._8_8_ | (ulong)!SUB81(uVar10,0) * auVar16._8_8_;
      auVar19 = vpand_avx(auVar18,auVar16);
      auVar17 = vpor_avx(auVar19,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)(int)uVar13 + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)(int)uVar13 + -3].cells.vec + 2) = auVar17;
      pSVar11 = (State *)(ulong)uVar13;
      bVar8 = BandEliminate<1>(&local_240,uVar13,0);
      if ((bVar8) &&
         (CountSolutionsConsistentWithPartialAssignment
                    ((SolverDpllTriadSimd<2> *)&local_240,pSVar11),
         (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_))
      {
        return;
      }
      pSVar11 = (State *)(ulong)uVar13;
      auVar16 = vpternlogq_avx512vl(auVar16,auVar19,
                                    *(undefined1 (*) [16])
                                     ((this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec + 2)
                                    ,0xbe);
      *(undefined1 (*) [16])((this->solution_).boxen[(long)(int)uVar13 + -3].cells.vec + 2) =
           auVar16;
      bVar8 = BandEliminate<1>(&this->solution_,uVar13,0);
    }
    if (bVar8 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,pSVar11);
    }
  }
  else {
    (anonymous_namespace)::solver_enum._488_8_ = (anonymous_namespace)::solver_enum._488_8_ + 1;
    if ((anonymous_namespace)::solver_enum._504_8_ != 0) {
      lVar9 = 0;
      do {
        uVar10 = (this->solution_).boxen[0].cells.vec[lVar9];
        uVar3 = (this->solution_).boxen[0].cells.vec[lVar9 + 1];
        uVar4 = (this->solution_).boxen[0].cells.vec[lVar9 + 2];
        lVar12 = (long)*(int *)((anonymous_namespace)::tables + lVar9 + 0x18dc) * 3 +
                 (long)*(int *)((anonymous_namespace)::tables + lVar9 + 0x18b8) * 0x1b;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar10; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar10 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar10 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12 + 1) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar10 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000)
        {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar10 >> 0x20 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].configurations + lVar12 + 2) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar3; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar3 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -7) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar3 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -6) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar3 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar3 >> 0x20 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + -5) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)uVar4; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if ((uint)uVar4 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 2) = cVar15;
        cVar15 = '\0';
        uVar14 = (uint)(uVar4 >> 0x10);
        for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar14 == 0) {
          cVar15 = '0';
        }
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 3) = cVar15;
        cVar15 = '\0';
        for (uVar13 = (uint)(uVar4 >> 0x20); (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x80000000) {
          cVar15 = cVar15 + '\x01';
        }
        cVar15 = cVar15 + '1';
        if (uVar4 >> 0x20 == 0) {
          cVar15 = '0';
        }
        lVar9 = lVar9 + 4;
        *(char *)((long)&local_240.bands[0][0].eliminations + lVar12 + 4) = cVar15;
      } while (lVar9 != 0x24);
      (*(code *)(anonymous_namespace)::solver_enum._504_8_)
                (&local_240,(anonymous_namespace)::solver_enum._512_8_);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }